

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

string * flatbuffers::StripPrefix
                   (string *__return_storage_ptr__,string *filepath,string *prefix_to_remove)

{
  int iVar1;
  
  iVar1 = strncmp((filepath->_M_dataplus)._M_p,(prefix_to_remove->_M_dataplus)._M_p,
                  prefix_to_remove->_M_string_length);
  if (iVar1 == 0) {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)filepath);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)filepath);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StripPrefix(const std::string &filepath,
                        const std::string &prefix_to_remove) {
  if (!strncmp(filepath.c_str(), prefix_to_remove.c_str(),
               prefix_to_remove.size())) {
    return filepath.substr(prefix_to_remove.size());
  }
  return filepath;
}